

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O1

void encode_block_pass1(int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                       TX_SIZE tx_size,void *arg)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  MACROBLOCK *x;
  tran_low_t *ptVar5;
  uint8_t *puVar6;
  _func_void_tran_low_t_ptr_uint8_t_ptr_int_TxfmParam_ptr **pp_Var7;
  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  
  lVar4 = *arg;
  x = *(MACROBLOCK **)((long)arg + 8);
  ptVar5 = x->plane[plane].dqcoeff;
  puVar6 = (x->e_mbd).plane[plane].dst.buf;
  iVar2 = (x->e_mbd).plane[plane].dst.stride;
  av1_setup_xform((AV1_COMMON *)(lVar4 + 0x3bf80),x,tx_size,'\0',&txfm_param);
  iVar3 = *(int *)(lVar4 + 0x423fc);
  quant_param.log_scale = av1_get_tx_scale(tx_size);
  quant_param.use_optimize_b = 0;
  quant_param.xform_quant_idx = 1;
  quant_param.qmatrix = (qm_val_t *)0x0;
  quant_param.iqmatrix = (qm_val_t *)0x0;
  quant_param.tx_size = tx_size;
  quant_param.use_quant_b_adapt = iVar3;
  quant_param.qmatrix =
       av1_get_qmatrix((CommonQuantParams *)(lVar4 + 0x3c1e8),&x->e_mbd,plane,tx_size,'\0');
  quant_param.iqmatrix =
       av1_get_iqmatrix((CommonQuantParams *)(lVar4 + 0x3c1e8),&x->e_mbd,plane,tx_size,'\0');
  av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param,&quant_param);
  uVar1 = x->plane[plane].eobs[block];
  if (uVar1 != 0) {
    txfm_param.eob = (int)uVar1;
    if (txfm_param.is_hbd == 0) {
      pp_Var7 = &av1_inv_txfm_add;
    }
    else {
      pp_Var7 = &av1_highbd_inv_txfm_add;
    }
    (**pp_Var7)(ptVar5 + (block << 4),puVar6 + (iVar2 * blk_row + blk_col) * 4,
                (x->e_mbd).plane[plane].dst.stride,&txfm_param);
  }
  return;
}

Assistant:

static void encode_block_pass1(int plane, int block, int blk_row, int blk_col,
                               BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                               void *arg) {
  encode_block_pass1_args *args = (encode_block_pass1_args *)arg;
  AV1_COMP *cpi = args->cpi;
  AV1_COMMON *cm = &cpi->common;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *const p = &x->plane[plane];
  struct macroblockd_plane *const pd = &xd->plane[plane];
  tran_low_t *const dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);

  uint8_t *dst;
  dst = &pd->dst.buf[(blk_row * pd->dst.stride + blk_col) << MI_SIZE_LOG2];

  TxfmParam txfm_param;
  QUANT_PARAM quant_param;

  av1_setup_xform(cm, x, tx_size, DCT_DCT, &txfm_param);
  av1_setup_quant(tx_size, 0, AV1_XFORM_QUANT_B, cpi->oxcf.q_cfg.quant_b_adapt,
                  &quant_param);
  av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, DCT_DCT,
                    &quant_param);

  av1_xform_quant(x, plane, block, blk_row, blk_col, plane_bsize, &txfm_param,
                  &quant_param);

  if (p->eobs[block] > 0) {
    txfm_param.eob = p->eobs[block];
    if (txfm_param.is_hbd) {
      av1_highbd_inv_txfm_add(dqcoeff, dst, pd->dst.stride, &txfm_param);
      return;
    }
    av1_inv_txfm_add(dqcoeff, dst, pd->dst.stride, &txfm_param);
  }
}